

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# STBase.cpp
# Opt level: O1

STBase * __thiscall jbcoin::STBase::operator=(STBase *this,STBase *t)

{
  if (0 < this->fName->fieldCode) {
    return this;
  }
  this->fName = t->fName;
  return this;
}

Assistant:

STBase&
STBase::operator= (const STBase& t)
{
    if ((t.fName != fName) && fName->isUseful() && t.fName->isUseful())
    {
        // VFALCO We shouldn't be logging at this low a level
        /*
        WriteLog ((t.getSType () == STI_AMOUNT) ? lsTRACE : lsWARNING, STBase) // This is common for amounts
                << "Caution: " << t.fName->getName () << " not replacing " << fName->getName ();
        */
    }
    if (!fName->isUseful())
        fName = t.fName;
    return *this;
}